

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O3

void ImStb::stb_text_makeundo_replace
               (ImGuiInputTextState *str,STB_TexteditState *state,int where,int old_length,
               int new_length)

{
  ImWchar *pIVar1;
  int iVar2;
  ulong uVar3;
  
  pIVar1 = stb_text_createundo(&state->undostate,where,old_length,new_length);
  if (0 < old_length && pIVar1 != (ImWchar *)0x0) {
    iVar2 = (str->TextW).Size;
    if (iVar2 <= where) {
      iVar2 = where;
    }
    uVar3 = 0;
    do {
      if ((uint)(iVar2 - where) == uVar3) {
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                      ,0x52f,
                      "const T &ImVector<unsigned short>::operator[](int) const [T = unsigned short]"
                     );
      }
      pIVar1[uVar3] = (str->TextW).Data[(long)where + uVar3];
      uVar3 = uVar3 + 1;
    } while ((uint)old_length != uVar3);
  }
  return;
}

Assistant:

static void stb_text_makeundo_replace(STB_TEXTEDIT_STRING *str, STB_TexteditState *state, int where, int old_length, int new_length)
{
   int i;
   STB_TEXTEDIT_CHARTYPE *p = stb_text_createundo(&state->undostate, where, old_length, new_length);
   if (p) {
      for (i=0; i < old_length; ++i)
         p[i] = STB_TEXTEDIT_GETCHAR(str, where+i);
   }
}